

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O1

bool __thiscall
cmCMakePresetsGraphInternal::NotCondition::Evaluate
          (NotCondition *this,
          vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
          *expanders,int version,optional<bool> *out)

{
  bool bVar1;
  int iVar2;
  
  if ((out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
      _M_engaged == true) {
    (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
    _M_engaged = false;
  }
  iVar2 = (*((this->SubCondition)._M_t.
             super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl)->
            _vptr_Condition[2])();
  bVar1 = (out->super__Optional_base<bool,_true,_true>)._M_payload.
          super__Optional_payload_base<bool>._M_engaged;
  if (SUB41(iVar2,0) == false) {
    if (bVar1 != false) {
      (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
      _M_engaged = false;
    }
  }
  else if (bVar1 != false) {
    (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
    _M_payload._M_value =
         (bool)((out->super__Optional_base<bool,_true,_true>)._M_payload.
                super__Optional_payload_base<bool>._M_payload._M_value ^ 1);
  }
  return SUB41(iVar2,0);
}

Assistant:

bool cmCMakePresetsGraphInternal::NotCondition::Evaluate(
  const std::vector<MacroExpander>& expanders, int version,
  cm::optional<bool>& out) const
{
  out.reset();
  if (!this->SubCondition->Evaluate(expanders, version, out)) {
    out.reset();
    return false;
  }
  if (out) {
    *out = !*out;
  }
  return true;
}